

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O1

parser_error parse_ghost_speed(parser *p)

{
  long *plVar1;
  wchar_t wVar2;
  void *pvVar3;
  long *plVar4;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 != (void *)0x0) {
    plVar1 = *(long **)((long)pvVar3 + 0x18);
    do {
      plVar4 = plVar1;
      plVar1 = (long *)*plVar4;
    } while ((long *)*plVar4 != (long *)0x0);
    wVar2 = parser_getint(p,"add");
    *(wchar_t *)(plVar4 + 6) = wVar2;
    wVar2 = parser_getint(p,"max");
    *(wchar_t *)((long)plVar4 + 0x34) = wVar2;
    return PARSE_ERROR_NONE;
  }
  __assert_fail("g",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                ,0x800,"enum parser_error parse_ghost_speed(struct parser *)");
}

Assistant:

static enum parser_error parse_ghost_speed(struct parser *p) {
	struct ghost *g = parser_priv(p);
	struct ghost_level *l;
	assert(g);
	l = g->level;
	while (l->next) {
		l = l->next;
	}

	l->speed.param1 = parser_getint(p, "add");
	l->speed.param2 = parser_getint(p, "max");
	return PARSE_ERROR_NONE;
}